

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.c
# Opt level: O0

void double_differences_do_not_matter_past_significant_figures(void)

{
  undefined8 uVar1;
  
  significant_figures_for_assert_double_are(3);
  uVar1 = create_equal_to_double_constraint(0x3ff1d70a3d70a3d7,"1.115");
  assert_that_double_(0x3ff1ced916872b02,
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
                      ,0xbe,"1.113",uVar1);
  uVar1 = create_equal_to_double_constraint(0x40916c0000000000,"1115");
  assert_that_double_(0x4091640000000000,
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
                      ,0xbf,"1113",uVar1);
  uVar1 = create_equal_to_double_constraint(0x4131037800000000,"1115000");
  assert_that_double_(0x4130fba800000000,
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
                      ,0xc0,"1113000",uVar1);
  uVar1 = create_less_than_double_constraint(0x3ff1c28f5c28f5c3,"1.11");
  assert_that_double_(0x3ff1eb851eb172b4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
                      ,0xc1,"1.1199999999",uVar1);
  uVar1 = create_greater_than_double_constraint(0x3ff1eb841248d7e0,"1.119999");
  assert_that_double_(0x3ff1c28f5c28f5c3,
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/assertion_tests.c"
                      ,0xc2,"1.11",uVar1);
  return;
}

Assistant:

Ensure(double_differences_do_not_matter_past_significant_figures) {
    significant_figures_for_assert_double_are(3);
    assert_that_double(1.113, is_equal_to_double(1.115));
    assert_that_double(1113, is_equal_to_double(1115));
    assert_that_double(1113000, is_equal_to_double(1115000));
    assert_that_double(1.1199999999, is_less_than_double(1.11));
    assert_that_double(1.11, is_greater_than_double(1.119999));
}